

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int SSL_get_verify_callback(int param_1,X509_STORE_CTX *param_2)

{
  bool bVar1;
  pointer pSVar2;
  undefined4 in_register_0000003c;
  SSL *ssl;
  SSL *ssl_local;
  
  ssl = (SSL *)CONCAT44(in_register_0000003c,param_1);
  bssl::check_ssl_x509_method(ssl);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    ssl_local._0_4_ = (int)pSVar2->verify_callback;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
    if (!bVar1) {
      __assert_fail("ssl->config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                    ,0x1da,"int (*SSL_get_verify_callback(const SSL *))(int, X509_STORE_CTX *)");
    }
    ssl_local._0_4_ = 0;
  }
  return (int)ssl_local;
}

Assistant:

int (*SSL_get_verify_callback(const SSL *ssl))(int, X509_STORE_CTX *) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    assert(ssl->config);
    return 0;
  }
  return ssl->config->verify_callback;
}